

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

void __thiscall
AmstradCPC::ConcreteMachine<false>::flush_output(ConcreteMachine<false> *this,int outputs)

{
  if ((outputs & 2U) == 0) {
    return;
  }
  AYDeferrer::update(&this->ay_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&(this->ay_).audio_queue_);
  return;
}

Assistant:

void flush_output(int outputs) final {
			// Just flush the AY.
			if(outputs & Output::Audio) {
				ay_.update();
				ay_.flush();
			}

			// Always flush the FDC.
			flush_fdc();
		}